

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void remove_short_regions(REGIONS *regions,int *num_regions,REGION_TYPES type,int length)

{
  uint uVar1;
  int in_ECX;
  REGION_TYPES in_EDX;
  int *in_RSI;
  REGIONS *in_RDI;
  int unaff_retaddr;
  int k;
  int *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (iVar2 < *in_RSI) {
      uVar1 = CONCAT13(1 < *in_RSI,(int3)in_stack_ffffffffffffffe0);
    }
    in_stack_ffffffffffffffe0 = uVar1;
    if ((char)(in_stack_ffffffffffffffe0 >> 0x18) == '\0') break;
    if (((in_RDI[iVar2].last - in_RDI[iVar2].start) + 1 < in_ECX) && (in_RDI[iVar2].type == in_EDX))
    {
      remove_region(unaff_retaddr,in_RDI,in_RSI,(int *)CONCAT44(in_EDX,in_ECX));
    }
    else {
      iVar2 = iVar2 + 1;
    }
  }
  cleanup_regions((REGIONS *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void remove_short_regions(REGIONS *regions, int *num_regions,
                                 REGION_TYPES type, int length) {
  int k = 0;
  while (k < *num_regions && (*num_regions) > 1) {
    if ((regions[k].last - regions[k].start + 1 < length &&
         regions[k].type == type)) {
      // merge current region with the previous and next regions
      remove_region(2, regions, num_regions, &k);
    } else {
      k++;
    }
  }
  cleanup_regions(regions, num_regions);
}